

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_lib.c
# Opt level: O0

long CONF_get_number(lhash_st_CONF_VALUE *conf,char *group,char *name)

{
  CONF ctmp;
  long result;
  int status;
  long local_60;
  CONF local_58 [2];
  long local_28;
  int local_1c;
  char *local_18;
  char *local_10;
  lhash_st_CONF_VALUE *local_8;
  
  local_28 = 0;
  local_18 = name;
  local_10 = group;
  local_8 = conf;
  ERR_set_mark();
  if (local_8 == (lhash_st_CONF_VALUE *)0x0) {
    local_1c = NCONF_get_number_e((CONF *)0x0,local_10,local_18,&local_28);
  }
  else {
    CONF_set_nconf(local_58,local_8);
    local_1c = NCONF_get_number_e(local_58,local_10,local_18,&local_28);
  }
  ERR_pop_to_mark();
  if (local_1c == 0) {
    local_60 = 0;
  }
  else {
    local_60 = local_28;
  }
  return local_60;
}

Assistant:

long CONF_get_number(LHASH_OF(CONF_VALUE) *conf, const char *group,
                     const char *name)
{
    int status;
    long result = 0;

    ERR_set_mark();
    if (conf == NULL) {
        status = NCONF_get_number_e(NULL, group, name, &result);
    } else {
        CONF ctmp;

        CONF_set_nconf(&ctmp, conf);
        status = NCONF_get_number_e(&ctmp, group, name, &result);
    }
    ERR_pop_to_mark();
    return status == 0 ? 0L : result;
}